

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O2

void __thiscall HttpServer::OnConnection(HttpServer *this,Handle *handle,uint32_t err)

{
  element_type *peVar1;
  HttpContext *this_00;
  
  if (err != 0) {
    return;
  }
  this_00 = (HttpContext *)operator_new(0x90);
  HttpContext::HttpContext(this_00);
  peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_CNSocket[9])(peVar1,this_00);
  return;
}

Assistant:

void HttpServer::OnConnection(cppnet::Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        auto context = new HttpContext();
        handle->SetContext((void*)context);
    }
}